

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Eigen::Matrix<double,-1,-1,0,-1,-1>::
Matrix<Eigen::internal::inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (Matrix<double,_1,_1,0,_1,_1> *this,
          ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  Index nbRows;
  Index nbCols;
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other_local;
  Matrix<double,__1,__1,_0,__1,__1> *this_local;
  
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::PlainObjectBase
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_check_template_params();
  nbRows = ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::rows(other);
  nbCols = ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::cols(other);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,nbRows,nbCols);
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
             other,(Matrix<double,__1,__1,_0,__1,__1> *)this);
  return;
}

Assistant:

EIGEN_STRONG_INLINE Matrix(const ReturnByValue<OtherDerived>& other)
    {
      Base::_check_template_params();
      Base::resize(other.rows(), other.cols());
      other.evalTo(*this);
    }